

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cc
# Opt level: O0

Packet * __thiscall
iqxmlrpc::Https_proxy_client_connection::do_process_session
          (Https_proxy_client_connection *this,string *s)

{
  Packet *pPVar1;
  undefined1 local_148 [8];
  Https_client_connection https_conn;
  string *s_local;
  Https_proxy_client_connection *this_local;
  
  https_conn._296_8_ = s;
  setup_tunnel(this);
  Https_client_connection::Https_client_connection
            ((Https_client_connection *)local_148,&(this->super_Connection).sock,
             (bool)(this->non_blocking & 1));
  Https_client_connection::post_connect((Https_client_connection *)local_148);
  pPVar1 = Https_client_connection::do_process_session
                     ((Https_client_connection *)local_148,(string *)https_conn._296_8_);
  Https_client_connection::~Https_client_connection((Https_client_connection *)local_148);
  return pPVar1;
}

Assistant:

http::Packet* Https_proxy_client_connection::do_process_session( const std::string& s )
{
  setup_tunnel();

  Https_client_connection https_conn(sock, non_blocking);
  https_conn.post_connect();

  return https_conn.do_process_session(s);
}